

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O3

void nn_cws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  void **self_00;
  nn_fsm_fn addrlen;
  int iVar1;
  size_t addrlen_00;
  char *pcVar2;
  char *host;
  nn_fsm *extraout_RAX;
  long lVar3;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  int extraout_EDX_02;
  nn_fsm_fn *pp_Var4;
  int *piVar5;
  nn_fsm *self_01;
  nn_fsm *pnVar6;
  byte bVar7;
  int val;
  int ipv4only;
  size_t locallen;
  size_t ipv4onlylen;
  sockaddr_storage local;
  undefined1 auStack_158 [4];
  int local_154;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  sockaddr_storage local_138;
  nn_fsm local_b0;
  
  bVar7 = 0;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
LAB_0012e696:
        nn_cws_start_resolving((nn_cws *)self);
        return;
      }
      nn_cws_handler_cold_23();
      type = extraout_EDX;
      goto switchD_0012e2c0_caseD_5;
    }
LAB_0012e768:
    nn_cws_handler_cold_22();
LAB_0012e771:
    nn_cws_handler_cold_20();
LAB_0012e77a:
    nn_cws_handler_cold_7();
LAB_0012e783:
    nn_cws_handler_cold_5();
    type = extraout_EDX_00;
LAB_0012e78c:
    src = type;
    nn_cws_handler_cold_1();
LAB_0012e795:
    nn_cws_handler_cold_14();
    break;
  case 2:
    if (src != 3) goto LAB_0012e771;
    if (type == 1) {
      nn_dns_stop((nn_dns *)&self[0x53].srcptr);
      *(undefined4 *)&self[1].fn = 3;
      return;
    }
    goto LAB_0012e7a3;
  case 3:
    if (src != 3) goto LAB_0012e74d;
    if (type != 2) goto LAB_0012e795;
    if (*(int *)&self[0x57].stopped.fsm != 0) {
LAB_0012e65f:
      nn_backoff_start((nn_backoff *)&self[8].owner);
      *(undefined4 *)&self[1].fn = 8;
      return;
    }
    addrlen = self[0x59].shutdown_fn;
    local_138.ss_family = 0;
    local_138.__ss_padding[0] = '\0';
    local_138.__ss_padding[1] = '\0';
    local_138.__ss_padding[2] = '\0';
    local_138.__ss_padding[3] = '\0';
    local_138.__ss_padding[4] = '\0';
    local_138.__ss_padding[5] = '\0';
    local_138.__ss_padding[6] = '\0';
    local_138.__ss_padding[7] = '\0';
    local_138.__ss_padding[8] = '\0';
    local_138.__ss_padding[9] = '\0';
    local_138.__ss_padding[10] = '\0';
    local_138.__ss_padding[0xb] = '\0';
    local_138.__ss_padding[0xc] = '\0';
    local_138.__ss_padding[0xd] = '\0';
    local_138.__ss_padding[0xe] = '\0';
    local_138.__ss_padding[0xf] = '\0';
    local_138.__ss_padding[0x10] = '\0';
    local_138.__ss_padding[0x11] = '\0';
    local_138.__ss_padding[0x12] = '\0';
    local_138.__ss_padding[0x13] = '\0';
    local_138.__ss_padding[0x14] = '\0';
    local_138.__ss_padding[0x15] = '\0';
    local_138.__ss_padding[0x16] = '\0';
    local_138.__ss_padding[0x17] = '\0';
    local_138.__ss_padding[0x18] = '\0';
    local_138.__ss_padding[0x19] = '\0';
    local_138.__ss_padding[0x1a] = '\0';
    local_138.__ss_padding[0x1b] = '\0';
    local_138.__ss_padding[0x1c] = '\0';
    local_138.__ss_padding[0x1d] = '\0';
    local_138.__ss_padding[0x1e] = '\0';
    local_138.__ss_padding[0x1f] = '\0';
    local_138.__ss_padding[0x20] = '\0';
    local_138.__ss_padding[0x21] = '\0';
    local_138.__ss_padding[0x22] = '\0';
    local_138.__ss_padding[0x23] = '\0';
    local_138.__ss_padding[0x24] = '\0';
    local_138.__ss_padding[0x25] = '\0';
    local_138.__ss_padding[0x26] = '\0';
    local_138.__ss_padding[0x27] = '\0';
    local_138.__ss_padding[0x28] = '\0';
    local_138.__ss_padding[0x29] = '\0';
    local_138.__ss_padding[0x2a] = '\0';
    local_138.__ss_padding[0x2b] = '\0';
    local_138.__ss_padding[0x2c] = '\0';
    local_138.__ss_padding[0x2d] = '\0';
    local_138.__ss_padding[0x2e] = '\0';
    local_138.__ss_padding[0x2f] = '\0';
    local_138.__ss_padding[0x30] = '\0';
    local_138.__ss_padding[0x31] = '\0';
    local_138.__ss_padding[0x32] = '\0';
    local_138.__ss_padding[0x33] = '\0';
    local_138.__ss_padding[0x34] = '\0';
    local_138.__ss_padding[0x35] = '\0';
    local_138.__ss_padding[0x36] = '\0';
    local_138.__ss_padding[0x37] = '\0';
    local_138.__ss_padding[0x38] = '\0';
    local_138.__ss_padding[0x39] = '\0';
    local_138.__ss_padding[0x3a] = '\0';
    local_138.__ss_padding[0x3b] = '\0';
    local_138.__ss_padding[0x3c] = '\0';
    local_138.__ss_padding[0x3d] = '\0';
    local_138.__ss_padding[0x3e] = '\0';
    local_138.__ss_padding[0x3f] = '\0';
    local_138.__ss_padding[0x40] = '\0';
    local_138.__ss_padding[0x41] = '\0';
    local_138.__ss_padding[0x42] = '\0';
    local_138.__ss_padding[0x43] = '\0';
    local_138.__ss_padding[0x44] = '\0';
    local_138.__ss_padding[0x45] = '\0';
    local_138.__ss_padding[0x46] = '\0';
    local_138.__ss_padding[0x47] = '\0';
    local_138.__ss_padding[0x48] = '\0';
    local_138.__ss_padding[0x49] = '\0';
    local_138.__ss_padding[0x4a] = '\0';
    local_138.__ss_padding[0x4b] = '\0';
    local_138.__ss_padding[0x4c] = '\0';
    local_138.__ss_padding[0x4d] = '\0';
    local_138.__ss_padding[0x4e] = '\0';
    local_138.__ss_padding[0x4f] = '\0';
    local_138.__ss_padding[0x50] = '\0';
    local_138.__ss_padding[0x51] = '\0';
    local_138.__ss_padding[0x52] = '\0';
    local_138.__ss_padding[0x53] = '\0';
    local_138.__ss_padding[0x54] = '\0';
    local_138.__ss_padding[0x55] = '\0';
    local_138.__ss_padding[0x56] = '\0';
    local_138.__ss_padding[0x57] = '\0';
    local_138.__ss_padding[0x58] = '\0';
    local_138.__ss_padding[0x59] = '\0';
    local_138.__ss_padding[0x5a] = '\0';
    local_138.__ss_padding[0x5b] = '\0';
    local_138.__ss_padding[0x5c] = '\0';
    local_138.__ss_padding[0x5d] = '\0';
    local_138.__ss_padding[0x5e] = '\0';
    local_138.__ss_padding[0x5f] = '\0';
    local_138.__ss_padding[0x60] = '\0';
    local_138.__ss_padding[0x61] = '\0';
    local_138.__ss_padding[0x62] = '\0';
    local_138.__ss_padding[99] = '\0';
    local_138.__ss_padding[100] = '\0';
    local_138.__ss_padding[0x65] = '\0';
    local_138.__ss_padding[0x66] = '\0';
    local_138.__ss_padding[0x67] = '\0';
    local_138.__ss_padding[0x68] = '\0';
    local_138.__ss_padding[0x69] = '\0';
    local_138.__ss_padding[0x6a] = '\0';
    local_138.__ss_padding[0x6b] = '\0';
    local_138.__ss_padding[0x6c] = '\0';
    local_138.__ss_padding[0x6d] = '\0';
    local_138.__ss_padding[0x6e] = '\0';
    local_138.__ss_padding[0x6f] = '\0';
    local_138.__ss_padding[0x70] = '\0';
    local_138.__ss_padding[0x71] = '\0';
    local_138.__ss_padding[0x72] = '\0';
    local_138.__ss_padding[0x73] = '\0';
    local_138.__ss_padding[0x74] = '\0';
    local_138.__ss_padding[0x75] = '\0';
    local_138.__ss_align = 0;
    local_140 = 4;
    pp_Var4 = &self[1].shutdown_fn;
    nn_epbase_getopt((nn_epbase *)pp_Var4,0,0xe,&local_154,&local_140);
    if (local_140 != 4) {
      nn_cws_handler_cold_15();
LAB_0012e733:
      nn_cws_handler_cold_16();
LAB_0012e738:
      nn_cws_handler_cold_17();
LAB_0012e73d:
      nn_cws_handler_cold_18();
      goto LAB_0012e744;
    }
    piVar5 = &self[0x52].stopped.src;
    pcVar2 = (char *)nn_chunkref_data((nn_chunkref *)piVar5);
    addrlen_00 = nn_chunkref_size((nn_chunkref *)piVar5);
    iVar1 = nn_iface_resolve(pcVar2,addrlen_00,local_154,&local_138,&local_148);
    if (iVar1 < 0) goto LAB_0012e65f;
    piVar5 = &self[0x57].stopped.src;
    self_01 = &local_b0;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      self_01->fn = *(nn_fsm_fn *)piVar5;
      piVar5 = piVar5 + ((ulong)bVar7 * -2 + 1) * 2;
      self_01 = (nn_fsm *)((long)self_01 + (ulong)bVar7 * -0x10 + 8);
    }
    src = (int)(ushort)local_b0.fn;
    if (((ushort)local_b0.fn | 8) == 10) {
      local_b0.fn._2_2_ = *(ushort *)&self[0x53].fn << 8 | *(ushort *)&self[0x53].fn >> 8;
      self_00 = &self[1].srcptr;
      iVar1 = nn_usock_start((nn_usock *)self_00,(uint)(ushort)local_b0.fn,1,0);
      if (iVar1 < 0) goto LAB_0012e65f;
      local_150 = 4;
      nn_epbase_getopt((nn_epbase *)pp_Var4,0,2,auStack_158,&local_150);
      if (local_150 != 4) goto LAB_0012e733;
      nn_usock_setsockopt((nn_usock *)self_00,1,7,auStack_158,4);
      local_150 = 4;
      nn_epbase_getopt((nn_epbase *)pp_Var4,0,3,auStack_158,&local_150);
      if (local_150 != 4) goto LAB_0012e738;
      nn_usock_setsockopt((nn_usock *)self_00,1,8,auStack_158,4);
      iVar1 = nn_usock_bind((nn_usock *)self_00,(sockaddr *)&local_138,local_148);
      if (iVar1 == 0) {
        nn_usock_connect((nn_usock *)self_00,(sockaddr *)&local_b0,(size_t)addrlen);
        *(undefined4 *)&self[1].fn = 4;
        nn_epbase_stat_increment((nn_epbase *)pp_Var4,0xca,1);
        return;
      }
      goto LAB_0012e73d;
    }
    goto LAB_0012e7d2;
  case 4:
    if (src != 1) goto LAB_0012e756;
    if (type == 5) {
      iVar1 = nn_usock_geterrno((nn_usock *)&self[1].srcptr);
      nn_epbase_set_error((nn_epbase *)&self[1].shutdown_fn,iVar1);
      nn_usock_stop((nn_usock *)&self[1].srcptr);
      *(undefined4 *)&self[1].fn = 7;
      nn_epbase_stat_increment((nn_epbase *)&self[1].shutdown_fn,0xca,-1);
      iVar1 = 0x69;
      goto LAB_0012e713;
    }
    if (type == 1) {
      pcVar2 = (char *)nn_chunkref_data((nn_chunkref *)&self[0x51].stopped.item);
      host = (char *)nn_chunkref_data((nn_chunkref *)&self[0x52].srcptr);
      nn_sws_start((nn_sws *)&self[0xb].srcptr,(nn_usock *)&self[1].srcptr,1,pcVar2,host,
                   (uint8_t)self[0xb].state);
      *(undefined4 *)&self[1].fn = 5;
      self[0x53].state = 0;
      pp_Var4 = &self[1].shutdown_fn;
      nn_epbase_stat_increment((nn_epbase *)pp_Var4,0xca,-1);
      nn_epbase_stat_increment((nn_epbase *)pp_Var4,0x65,1);
      nn_epbase_clear_error((nn_epbase *)pp_Var4);
      return;
    }
    goto LAB_0012e7bd;
  case 5:
switchD_0012e2c0_caseD_5:
    if (src != 4) {
LAB_0012e744:
      nn_cws_handler_cold_9();
LAB_0012e74d:
      nn_cws_handler_cold_13();
LAB_0012e756:
      nn_cws_handler_cold_11();
LAB_0012e75f:
      nn_cws_handler_cold_3();
      goto LAB_0012e768;
    }
    if (type == 1) {
      nn_sws_stop((nn_sws *)&self[0xb].srcptr);
      *(undefined4 *)&self[1].fn = 6;
      iVar1 = 0x68;
LAB_0012e713:
      nn_epbase_stat_increment((nn_epbase *)&self[1].shutdown_fn,iVar1,1);
      return;
    }
    src = 4;
    if (type == 2) {
      nn_sws_stop((nn_sws *)&self[0xb].srcptr);
      *(undefined4 *)&self[1].fn = 6;
      self[0x53].state = 1;
      return;
    }
    goto LAB_0012e7b6;
  case 6:
    if (src != 4) goto LAB_0012e77a;
    if (type == 8) {
      return;
    }
    if (type == 3) {
      nn_usock_stop((nn_usock *)&self[1].srcptr);
      *(undefined4 *)&self[1].fn = 7;
      return;
    }
    goto LAB_0012e7c4;
  case 7:
    if (src != 1) goto LAB_0012e783;
    if (type == 8) {
      return;
    }
    if (type == 7) {
      if (self[0x53].state != 0) {
        return;
      }
      goto LAB_0012e65f;
    }
    goto LAB_0012e7cb;
  case 8:
    if (src != 2) goto LAB_0012e75f;
    if (type == 1) {
      nn_backoff_stop((nn_backoff *)&self[8].owner);
      *(undefined4 *)&self[1].fn = 9;
      return;
    }
    break;
  case 9:
    if (src != 2) goto LAB_0012e78c;
    if (type == 2) goto LAB_0012e696;
    goto LAB_0012e7aa;
  default:
    goto switchD_0012e2c0_default;
  }
  nn_cws_handler_cold_4();
LAB_0012e7a3:
  nn_cws_handler_cold_21();
LAB_0012e7aa:
  nn_cws_handler_cold_2();
switchD_0012e2c0_default:
  nn_cws_handler_cold_24();
LAB_0012e7b6:
  nn_cws_handler_cold_10();
LAB_0012e7bd:
  nn_cws_handler_cold_12();
LAB_0012e7c4:
  nn_cws_handler_cold_8();
  type = extraout_EDX_01;
LAB_0012e7cb:
  self_01 = (nn_fsm *)(ulong)(uint)type;
  nn_cws_handler_cold_6();
LAB_0012e7d2:
  nn_cws_handler_cold_19();
  if (extraout_EDX_02 == -3 && src == 0xfffffffe) {
LAB_0012e802:
    nn_cws_shutdown_cold_2();
    pnVar6 = extraout_RAX;
  }
  else {
    pnVar6 = self_01 + 1;
    if (*(int *)&self_01[1].fn == 0xb) goto LAB_0012e84b;
    if (*(int *)&self_01[1].fn != 10) {
      nn_cws_shutdown_cold_1();
      goto LAB_0012e802;
    }
  }
  iVar1 = nn_sws_isidle((nn_sws *)&self_01[0xb].srcptr);
  if (iVar1 == 0) {
    return;
  }
  nn_backoff_stop((nn_backoff *)&self_01[8].owner);
  nn_usock_stop((nn_usock *)&self_01[1].srcptr);
  nn_dns_stop((nn_dns *)&self_01[0x53].srcptr);
  *(undefined4 *)&pnVar6->fn = 0xb;
LAB_0012e84b:
  iVar1 = nn_backoff_isidle((nn_backoff *)&self_01[8].owner);
  if (((iVar1 != 0) && (iVar1 = nn_usock_isidle((nn_usock *)&self_01[1].srcptr), iVar1 != 0)) &&
     (iVar1 = nn_dns_isidle((nn_dns *)&self_01[0x53].srcptr), iVar1 != 0)) {
    *(undefined4 *)&pnVar6->fn = 1;
    nn_fsm_stopped_noevent(self_01);
    nn_epbase_stopped((nn_epbase *)&self_01[1].shutdown_fn);
    return;
  }
  return;
}

Assistant:

static void nn_cws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cws *cws;

    cws = nn_cont (self, struct nn_cws, fsm);

    switch (cws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_CWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_cws_start_resolving (cws);
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  RESOLVING state.                                                          */
/*  Name of the host to connect to is being resolved to get an IP address.    */
/******************************************************************************/
    case NN_CWS_STATE_RESOLVING:
        switch (src) {

        case NN_CWS_SRC_DNS:
            switch (type) {
            case NN_DNS_DONE:
                nn_dns_stop (&cws->dns);
                cws->state = NN_CWS_STATE_STOPPING_DNS;
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_DNS state.                                                       */
/*  dns object was asked to stop but it haven't stopped yet.                  */
/******************************************************************************/
    case NN_CWS_STATE_STOPPING_DNS:
        switch (src) {

        case NN_CWS_SRC_DNS:
            switch (type) {
            case NN_DNS_STOPPED:
                if (cws->dns_result.error == 0) {
                    nn_cws_start_connecting (cws, &cws->dns_result.addr,
                        cws->dns_result.addrlen);
                    return;
                }
                nn_backoff_start (&cws->retry);
                cws->state = NN_CWS_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  CONNECTING state.                                                         */
/*  Non-blocking connect is under way.                                        */
/******************************************************************************/
    case NN_CWS_STATE_CONNECTING:
        switch (src) {

        case NN_CWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_CONNECTED:
                nn_sws_start (&cws->sws, &cws->usock, NN_WS_CLIENT,
                    nn_chunkref_data (&cws->resource),
                    nn_chunkref_data (&cws->remote_host), cws->msg_type);
                cws->state = NN_CWS_STATE_ACTIVE;
                cws->peer_gone = 0;
                nn_epbase_stat_increment (&cws->epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_epbase_stat_increment (&cws->epbase,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                nn_epbase_clear_error (&cws->epbase);
                return;
            case NN_USOCK_ERROR:
                nn_epbase_set_error (&cws->epbase,
                    nn_usock_geterrno (&cws->usock));
                nn_usock_stop (&cws->usock);
                cws->state = NN_CWS_STATE_STOPPING_USOCK;
                nn_epbase_stat_increment (&cws->epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_epbase_stat_increment (&cws->epbase,
                    NN_STAT_CONNECT_ERRORS, 1);
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Connection is established and handled by the sws state machine.           */
/******************************************************************************/
    case NN_CWS_STATE_ACTIVE:
        switch (src) {

        case NN_CWS_SRC_SWS:
            switch (type) {
            case NN_SWS_RETURN_CLOSE_HANDSHAKE:
                /*  Peer closed connection without intention to reconnect, or
                    local endpoint failed remote because of invalid data. */
                nn_sws_stop (&cws->sws);
                cws->state = NN_CWS_STATE_STOPPING_SWS;
                cws->peer_gone = 1;
                return;
            case NN_SWS_RETURN_ERROR:
                nn_sws_stop (&cws->sws);
                cws->state = NN_CWS_STATE_STOPPING_SWS;
                nn_epbase_stat_increment (&cws->epbase,
                    NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_SWS state.                                                       */
/*  sws object was asked to stop but it haven't stopped yet.                  */
/******************************************************************************/
    case NN_CWS_STATE_STOPPING_SWS:
        switch (src) {

        case NN_CWS_SRC_SWS:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_SWS_RETURN_STOPPED:
                nn_usock_stop (&cws->usock);
                cws->state = NN_CWS_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                     */
/*  usock object was asked to stop but it haven't stopped yet.                */
/******************************************************************************/
    case NN_CWS_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_CWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                /*  If the peer has confirmed itself gone with a Closing
                    Handshake, or if the local endpoint failed the remote,
                    don't try to reconnect. */
                if (cws->peer_gone) {
                    /*  It is expected that the application detects this and
                        prunes the connection with nn_shutdown. */
                }
                else {
                    nn_backoff_start (&cws->retry);
                    cws->state = NN_CWS_STATE_WAITING;
                }
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  WAITING state.                                                            */
/*  Waiting before re-connection is attempted. This way we won't overload     */
/*  the system by continuous re-connection attemps.                           */
/******************************************************************************/
    case NN_CWS_STATE_WAITING:
        switch (src) {

        case NN_CWS_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_TIMEOUT:
                nn_backoff_stop (&cws->retry);
                cws->state = NN_CWS_STATE_STOPPING_BACKOFF;
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_BACKOFF state.                                                   */
/*  backoff object was asked to stop, but it haven't stopped yet.             */
/******************************************************************************/
    case NN_CWS_STATE_STOPPING_BACKOFF:
        switch (src) {

        case NN_CWS_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_STOPPED:
                nn_cws_start_resolving (cws);
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (cws->state, src, type);
    }
}